

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlChar * xmlXPathParseLiteral(xmlXPathParserContextPtr ctxt)

{
  xmlChar *pxVar1;
  bool bVar2;
  xmlChar *local_28;
  xmlChar *ret;
  xmlChar *q;
  xmlXPathParserContextPtr ctxt_local;
  
  if (*ctxt->cur == '\"') {
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
    pxVar1 = ctxt->cur;
    while( true ) {
      if (((8 < *ctxt->cur) && (*ctxt->cur < 0xb)) ||
         ((*ctxt->cur == '\r' || (bVar2 = false, 0x1f < *ctxt->cur)))) {
        bVar2 = *ctxt->cur != '\"';
      }
      if (!bVar2) break;
      if (*ctxt->cur != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
    }
    if ((((*ctxt->cur < 9) || (10 < *ctxt->cur)) && (*ctxt->cur != '\r')) && (*ctxt->cur < 0x20)) {
      xmlXPathErr(ctxt,2);
      return (xmlChar *)0x0;
    }
    local_28 = xmlStrndup(pxVar1,(int)ctxt->cur - (int)pxVar1);
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
  }
  else {
    if (*ctxt->cur != '\'') {
      xmlXPathErr(ctxt,3);
      return (xmlChar *)0x0;
    }
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
    pxVar1 = ctxt->cur;
    while( true ) {
      if ((((8 < *ctxt->cur) && (*ctxt->cur < 0xb)) || (*ctxt->cur == '\r')) ||
         (bVar2 = false, 0x1f < *ctxt->cur)) {
        bVar2 = *ctxt->cur != '\'';
      }
      if (!bVar2) break;
      if (*ctxt->cur != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
    }
    if (((*ctxt->cur < 9) || (10 < *ctxt->cur)) && ((*ctxt->cur != '\r' && (*ctxt->cur < 0x20)))) {
      xmlXPathErr(ctxt,2);
      return (xmlChar *)0x0;
    }
    local_28 = xmlStrndup(pxVar1,(int)ctxt->cur - (int)pxVar1);
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
  }
  return local_28;
}

Assistant:

static xmlChar *
xmlXPathParseLiteral(xmlXPathParserContextPtr ctxt) {
    const xmlChar *q;
    xmlChar *ret = NULL;

    if (CUR == '"') {
        NEXT;
	q = CUR_PTR;
	while ((IS_CHAR_CH(CUR)) && (CUR != '"'))
	    NEXT;
	if (!IS_CHAR_CH(CUR)) {
	    XP_ERRORNULL(XPATH_UNFINISHED_LITERAL_ERROR);
	} else {
	    ret = xmlStrndup(q, CUR_PTR - q);
	    NEXT;
        }
    } else if (CUR == '\'') {
        NEXT;
	q = CUR_PTR;
	while ((IS_CHAR_CH(CUR)) && (CUR != '\''))
	    NEXT;
	if (!IS_CHAR_CH(CUR)) {
	    XP_ERRORNULL(XPATH_UNFINISHED_LITERAL_ERROR);
	} else {
	    ret = xmlStrndup(q, CUR_PTR - q);
	    NEXT;
        }
    } else {
	XP_ERRORNULL(XPATH_START_LITERAL_ERROR);
    }
    return(ret);
}